

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
_IPC_Decoder<perfetto::protos::gen::DisableTracingRequest>(string *proto_data)

{
  int iVar1;
  DisableTracingRequest *this;
  DisableTracingRequest *pDVar2;
  undefined8 *in_RSI;
  
  this = (DisableTracingRequest *)operator_new(0x30);
  perfetto::protos::gen::DisableTracingRequest::DisableTracingRequest(this);
  iVar1 = (*(this->super_CppMessageObj)._vptr_CppMessageObj[4])(this,*in_RSI,in_RSI[1]);
  if ((char)iVar1 == '\0') {
    (proto_data->_M_dataplus)._M_p = (pointer)0x0;
    pDVar2 = (DisableTracingRequest *)0x0;
  }
  else {
    pDVar2 = this;
    this = (DisableTracingRequest *)0x0;
  }
  (proto_data->_M_dataplus)._M_p = (pointer)pDVar2;
  if (this != (DisableTracingRequest *)0x0) {
    (*(this->super_CppMessageObj)._vptr_CppMessageObj[1])(this);
  }
  return (__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
          )(__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
            )proto_data;
}

Assistant:

::std::unique_ptr<::perfetto::ipc::ProtoMessage> _IPC_Decoder(
    const std::string& proto_data) {
  ::std::unique_ptr<::perfetto::ipc::ProtoMessage> msg(new T());
  if (msg->ParseFromString(proto_data))
    return msg;
  return nullptr;
}